

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O1

void play_game(game_mode_type mode)

{
  uint32_t *puVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  player *p;
  term *t;
  _Bool _Var5;
  _Bool _Var6;
  wchar_t wVar7;
  char **entries;
  char **entries_00;
  menu_iter *iter;
  menu *menu;
  ulong uVar8;
  char cVar9;
  savefile_details *psVar10;
  wchar_t wVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  size_t len;
  long lVar15;
  byte bVar16;
  ulong uVar17;
  ui_event uVar18;
  savefile_getter g;
  int local_70;
  savefile_getter local_68;
  game_mode_type local_5c;
  region local_58;
  char *local_40;
  ulong local_38;
  
  local_5c = mode;
  do {
    play_again = false;
    if (local_5c < GAME_SELECT) {
      _Var5 = start_game(local_5c == GAME_NEW);
      pcVar12 = "Broken savefile";
      if (!_Var5) {
LAB_001cf973:
        quit(pcVar12);
      }
    }
    else {
      pcVar12 = "Invalid game mode in play_game()";
      if (local_5c != GAME_SELECT) goto LAB_001cf973;
      _Var5 = false;
      pcVar12 = "";
      do {
        local_68 = (savefile_getter)0x0;
        local_40 = pcVar12;
        entries = (char **)mem_zalloc(0x80);
        entries_00 = (char **)mem_zalloc(0x80);
        local_58.col = 0;
        local_58.row = 3;
        local_58.width = 0;
        local_58.page_rows = 0;
        _Var6 = got_savefile(&local_68);
        if (_Var6) {
          uVar17 = 0;
          uVar14 = 0x10;
          uVar13 = 1;
          local_70 = 0;
          do {
            if (local_68 == (savefile_getter)0x0) {
              psVar10 = (savefile_details *)0x0;
            }
            else {
              psVar10 = &local_68->details;
              if (local_68->have_details == false) {
                psVar10 = (savefile_details *)0x0;
              }
            }
            if (psVar10 == (savefile_details *)0x0) {
              __assert_fail("details",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-game.c"
                            ,0x304,"void select_savefile(_Bool, _Bool *)");
            }
            if (uVar13 == uVar14) {
              uVar4 = (int)uVar14 * 2;
              len = (long)(int)uVar4 << 3;
              local_38 = uVar13;
              entries = (char **)mem_realloc(entries,len);
              uVar13 = local_38;
              uVar14 = (ulong)uVar4;
              entries_00 = (char **)mem_realloc(entries_00,len);
            }
            if (psVar10->desc == (char *)0x0) {
              pcVar12 = format("Use %s",psVar10->fnam + psVar10->foff);
            }
            else {
              pcVar12 = format("Use %s: %s",psVar10->fnam + psVar10->foff);
            }
            pcVar12 = string_make(pcVar12);
            entries[uVar13] = pcVar12;
            pcVar12 = string_make(psVar10->fnam);
            entries_00[uVar13] = pcVar12;
            _Var6 = suffix(savefile,psVar10->fnam);
            if (_Var6) {
              if (uVar13 != 1) {
                pcVar12 = entries[uVar13];
                pcVar2 = entries_00[uVar13];
                uVar8 = uVar17;
                do {
                  entries[uVar8 + 1] = entries[uVar8 & 0xffffffff];
                  entries_00[uVar8 + 1] = entries_00[uVar8 & 0xffffffff];
                  lVar15 = uVar8 + 1;
                  uVar8 = uVar8 - 1;
                } while (2 < lVar15);
                entries[1] = pcVar12;
                entries_00[1] = pcVar2;
              }
              local_70 = 1;
              if (arg_force_name == false) {
                savefile[0] = '\0';
                arg_name[0] = '\0';
              }
            }
            uVar13 = uVar13 + 1;
            _Var6 = got_savefile(&local_68);
            uVar17 = uVar17 + 1;
          } while (_Var6);
          bVar3 = 0 < (int)uVar14;
        }
        else {
          uVar13 = 1;
          bVar3 = true;
          local_70 = 0;
        }
        wVar11 = (wchar_t)uVar13;
        if (local_68 == (savefile_getter)0x0) {
          cVar9 = '\0';
        }
        else {
          cVar9 = local_68->have_savedir;
        }
        if (cVar9 == '\0') {
LAB_001cf807:
          bVar16 = 0;
          wVar7 = wVar11;
        }
        else {
          if ((!bVar3) || (*entries != (char *)0x0)) {
            __assert_fail("allocated > 0 && !entries[0]",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-game.c"
                          ,0x330,"void select_savefile(_Bool, _Bool *)");
          }
          if ((local_70 == 0) || (arg_force_name != true)) {
            pcVar12 = string_make("New game");
            *entries = pcVar12;
            goto LAB_001cf807;
          }
          if (*entries_00 != (char *)0x0) {
            __assert_fail("!entries[0] && !names[0]",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-game.c"
                          ,0x338,"void select_savefile(_Bool, _Bool *)");
          }
          wVar7 = wVar11 + L'\xffffffff';
          local_70 = 0;
          bVar16 = 1;
          if (L'\x01' < wVar11) {
            uVar13 = 0;
            do {
              entries[uVar13] = entries[uVar13 + 1];
              entries_00[uVar13] = entries_00[uVar13 + 1];
              uVar13 = uVar13 + 1;
            } while ((uint)wVar7 != uVar13);
          }
        }
        cleanup_savefile_getter(local_68);
        if (cVar9 == '\0') {
          cleanup_savefile_selection_strings(entries_00,wVar7);
          cleanup_savefile_selection_strings(entries,wVar7);
          quit("Cannot open the savefile directory");
        }
        iter = menu_find_iter(MN_ITER_STRINGS);
        menu = menu_new(MN_SKIN_SCROLL,iter);
        menu_setpriv(menu,wVar7,entries);
        menu_layout(menu,&local_58);
        menu->cursor = local_70;
        *(byte *)&menu->flags = (byte)menu->flags | 0x10;
        screen_save();
        prt("Select the save to use (movement keys and enter or mouse) or quit",L'\0',L'\0');
        prt("(escape or second mouse button).",L'\x01',L'\0');
        prt(local_40,L'\x02',L'\0');
        uVar18 = menu_select(menu,0,false);
        screen_load();
        if (uVar18.type == EVT_SELECT) {
          wVar11 = menu->cursor;
          _Var5 = true;
          if (!(bool)(~bVar16 & (ulong)(uint)wVar11 == 0)) {
            if ((wVar11 < L'\x01') || (wVar7 <= wVar11)) {
              __assert_fail("m->cursor > 0 && m->cursor < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-game.c"
                            ,0x362,"void select_savefile(_Bool, _Bool *)");
            }
            path_build(savefile,0x400,ANGBAND_DIR_SAVE,entries_00[(uint)wVar11]);
            _Var5 = false;
          }
        }
        menu_free(menu);
        cleanup_savefile_selection_strings(entries_00,wVar7);
        cleanup_savefile_selection_strings(entries,wVar7);
        if (uVar18.type == EVT_ESCAPE) {
          quit((char *)0x0);
        }
        _Var6 = start_game(_Var5);
        pcVar12 = "The previously selected savefile was unusable.";
      } while (!_Var6);
    }
    if (player->is_dead == false) {
      do {
        t = Term;
        p = player;
        if (player->upkeep->playing != true) break;
        if (character_dungeon == true) {
          puVar1 = &player->upkeep->redraw;
          *puVar1 = *puVar1 | 0xc18000;
          handle_stuff(p);
          if (((player->opts).opt[8] == true) && (_Var5 = target_sighted(), _Var5)) {
            target_get((loc_conflict *)&local_58);
            wVar11 = local_58.col;
            wVar7 = local_58.row;
          }
          else {
            wVar11 = (player->grid).x;
            wVar7 = (player->grid).y;
          }
          move_cursor_relative(wVar7,wVar11);
          lVar15 = 0;
          do {
            if (angband_term[lVar15] != (term *)0x0) {
              Term_activate(angband_term[lVar15]);
              Term_fresh();
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 8);
        }
        Term_activate(t);
        (*cmd_get_hook)(CTX_GAME);
        run_game_loop();
      } while (player->is_dead != true);
    }
    close_game(true);
    if (play_again != true) {
      return;
    }
    cleanup_angband();
    init_display();
    init_angband();
    if (reinit_hook != (_func_void *)0x0) {
      (*reinit_hook)();
    }
    textui_init();
    local_5c = local_5c + (local_5c == GAME_LOAD);
  } while( true );
}

Assistant:

void play_game(enum game_mode_type mode)
{
	while (1) {
		play_again = false;

		/* Load a savefile or birth a character, or both */
		switch (mode) {
		case GAME_LOAD:
		case GAME_NEW:
			if (!start_game(mode == GAME_NEW)) {
				quit("Broken savefile");
			}
			break;

		case GAME_SELECT:
			{
				bool new_game = false, retry = false;

				while (1) {
					select_savefile(retry, &new_game);
					if (start_game(new_game)) {
						break;
					}
					retry = true;
				}
			}
			break;

		default:
			quit("Invalid game mode in play_game()");
			break;
		}

		/* Get commands from the user, then process the game world
		 * until the command queue is empty and a new player command
		 * is needed */
		while (!player->is_dead && player->upkeep->playing) {
			pre_turn_refresh();
			cmd_get_hook(CTX_GAME);
			run_game_loop();
		}

		/* Close game on death or quitting */
		close_game(true);

		if (!play_again) break;

		cleanup_angband();
		init_display();
		init_angband();
		if (reinit_hook != NULL) {
			(*reinit_hook)();
		}
		textui_init();
		if (mode == GAME_LOAD) {
			mode = GAME_NEW;
		}
	}
}